

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermAggregate * __thiscall
glslang::HlslParseContext::assignClipCullDistance
          (HlslParseContext *this,TSourceLoc *loc,TOperator op,int semanticId,TIntermTyped *left,
          TIntermTyped *right)

{
  EShLanguage EVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference pvVar10;
  undefined4 extraout_var_01;
  TArraySizes *pTVar11;
  undefined4 extraout_var_02;
  ulong uVar12;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  long lVar13;
  undefined4 extraout_var_05;
  void *__src;
  TQualifier *pTVar14;
  undefined4 extraout_var_06;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_00;
  char *name;
  TVariable *pTVar15;
  TIntermSymbol *node;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  TIntermTyped *right_00;
  undefined4 extraout_var_14;
  int local_23c;
  int local_224;
  int local_220;
  byte local_216;
  byte local_215;
  int local_214;
  int local_210;
  int local_20c;
  _Type local_200;
  TVariable **local_1f8;
  _Type local_1f0;
  TVariable **local_1e8;
  TIntermTyped *local_1d8;
  TIntermTyped *local_1b8;
  TIntermTyped *internalMember;
  TIntermTyped *clipCullMember;
  int local_1a0;
  int internalComponent;
  int internalInnerArrayPos;
  int internalOuterArrayPos;
  anon_class_16_2_633b926d addIndex;
  int clipCullOuterArrayPos;
  int clipCullInnerArrayPos;
  TIntermTyped *clipCullAssign;
  TIntermAggregate *assignList;
  int clipCullInnerArraySize;
  int clipCullOuterArraySize;
  TArraySizes *clipCullArraySizes;
  int clipCullVectorSize;
  TIntermSymbol *clipCullSym;
  TIntermSymbol *sym;
  TArraySizes *arraySizes;
  TType clipCullType;
  int requiredOuterArraySize;
  int requiredInnerArraySize;
  bool useInnerSize;
  bool isImplicitlyArrayed;
  int internalOuterArraySize;
  int internalInnerArraySize;
  int internalVectorSize;
  int internalArrayDims;
  TArraySizes *internalArraySizes;
  int local_78;
  int x;
  int vecItems;
  int arrayLoc;
  array<int,_2UL> semanticOffset;
  array<int,_2UL> *semanticNSize;
  TBuiltInVariable builtInType;
  TIntermTyped *internalNode;
  TIntermTyped *clipCullNode;
  TVariable **ppTStack_40;
  bool isOutput;
  TVariable **clipCullVar;
  TIntermTyped *right_local;
  TIntermTyped *left_local;
  int semanticId_local;
  TOperator op_local;
  TSourceLoc *loc_local;
  HlslParseContext *this_local;
  
  EVar1 = (this->super_TParseContextBase).super_TParseVersions.language;
  if ((EVar1 == EShLangVertex) || (EVar1 == EShLangGeometry || EVar1 == EShLangFragment)) {
    iVar5 = (*(left->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar2 = isClipOrCullDistance((TType *)CONCAT44(extraout_var,iVar5));
    local_1d8 = left;
    if (bVar2) {
      local_1d8 = right;
      right = left;
    }
    iVar5 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x21])();
    uVar6 = *(uint *)(CONCAT44(extraout_var_00,iVar5) + 8) >> 7 & 0x1ff;
    semanticOffset._M_elems[0] = 0;
    semanticOffset._M_elems[1] = 0;
    if (uVar6 == 0x21) {
      if (bVar2) {
        local_1e8 = &this->clipDistanceOutput;
      }
      else {
        local_1e8 = &this->clipDistanceInput;
      }
      ppTStack_40 = local_1e8;
      if (bVar2) {
        local_1f0 = (_Type)&this->clipSemanticNSizeOut;
      }
      else {
        local_1f0 = (_Type)&this->clipSemanticNSizeIn;
      }
      semanticOffset._M_elems[0] = local_1f0[0];
      semanticOffset._M_elems[1] = local_1f0[1];
    }
    else {
      if (uVar6 != 0x22) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                      ,0xa53,
                      "TIntermAggregate *glslang::HlslParseContext::assignClipCullDistance(const TSourceLoc &, TOperator, int, TIntermTyped *, TIntermTyped *)"
                     );
      }
      if (bVar2) {
        local_1f8 = &this->cullDistanceOutput;
      }
      else {
        local_1f8 = &this->cullDistanceInput;
      }
      ppTStack_40 = local_1f8;
      if (bVar2) {
        local_200 = (_Type)&this->cullSemanticNSizeOut;
      }
      else {
        local_200 = (_Type)&this->cullSemanticNSizeIn;
      }
      semanticOffset._M_elems[0] = local_200[0];
      semanticOffset._M_elems[1] = local_200[1];
    }
    x = 0;
    local_78 = 0;
    for (internalArraySizes._4_4_ = 0; internalArraySizes._4_4_ < 2;
        internalArraySizes._4_4_ = internalArraySizes._4_4_ + 1) {
      pvVar10 = std::array<int,_2UL>::operator[]
                          ((array<int,_2UL> *)semanticOffset._M_elems,(long)internalArraySizes._4_4_
                          );
      if (4 < local_78 + *pvVar10) {
        x = x + 3U & 0xfffffffc;
        local_78 = 0;
      }
      pvVar10 = std::array<int,_2UL>::operator[]
                          ((array<int,_2UL> *)&vecItems,(long)internalArraySizes._4_4_);
      *pvVar10 = x;
      pvVar10 = std::array<int,_2UL>::operator[]
                          ((array<int,_2UL> *)semanticOffset._M_elems,(long)internalArraySizes._4_4_
                          );
      local_78 = *pvVar10 + local_78;
      pvVar10 = std::array<int,_2UL>::operator[]
                          ((array<int,_2UL> *)semanticOffset._M_elems,(long)internalArraySizes._4_4_
                          );
      x = *pvVar10 + x;
    }
    iVar5 = (*(local_1d8->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    pTVar11 = (TArraySizes *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x98))();
    iVar5 = (*(local_1d8->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    uVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar5) + 0xe8))();
    if ((uVar12 & 1) == 0) {
      local_20c = 0;
    }
    else {
      local_20c = TArraySizes::getNumDims(pTVar11);
    }
    iVar5 = (*(local_1d8->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    iVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar5) + 0x60))();
    if (local_20c < 1) {
      local_210 = 1;
    }
    else {
      local_210 = TArraySizes::getDimSize(pTVar11,local_20c + -1);
    }
    if (local_20c < 2) {
      local_214 = 1;
    }
    else {
      local_214 = TArraySizes::getDimSize(pTVar11,0);
    }
    local_215 = 0;
    if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangGeometry) {
      local_215 = bVar2 ^ 0xff;
    }
    local_215 = local_215 & 1;
    if (*ppTStack_40 == (TVariable *)0x0) {
      local_216 = 1;
      if (local_20c < 2) {
        local_216 = local_215 ^ 0xff;
      }
      if ((local_216 & 1) == 0) {
        local_220 = 1;
      }
      else {
        local_220 = local_210;
      }
      if (local_20c < 1) {
        local_224 = 1;
      }
      else {
        local_224 = TArraySizes::getDimSize(pTVar11,0);
      }
      clipCullType.spirvType._4_4_ = local_224;
      iVar7 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      lVar13 = (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar7) + 0x58))();
      TType::TType((TType *)&arraySizes,EbtFloat,
                   (TStorageQualifier)*(undefined8 *)(lVar13 + 8) & 0x7f,1,0,0,false);
      iVar7 = (*(right->super_TIntermNode)._vptr_TIntermNode[0x1e])();
      __src = (void *)(**(code **)(*(long *)CONCAT44(extraout_var_05,iVar7) + 0x58))();
      pTVar14 = TType::getQualifier((TType *)&arraySizes);
      memcpy(pTVar14,__src,0x50);
      pTVar11 = (TArraySizes *)TArraySizes::operator_new((TArraySizes *)0x18,(size_t)__src);
      TArraySizes::TArraySizes(pTVar11);
      if (local_215 != 0) {
        TArraySizes::addInnerSize(pTVar11,clipCullType.spirvType._4_4_);
      }
      TArraySizes::addInnerSize(pTVar11,x * local_220);
      TType::transferArraySizes((TType *)&arraySizes,pTVar11);
      iVar7 = (*(right->super_TIntermNode)._vptr_TIntermNode[0xc])();
      if ((long *)CONCAT44(extraout_var_06,iVar7) == (long *)0x0) {
        __assert_fail("sym != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                      ,0xa96,
                      "TIntermAggregate *glslang::HlslParseContext::assignClipCullDistance(const TSourceLoc &, TOperator, int, TIntermTyped *, TIntermTyped *)"
                     );
      }
      pTVar14 = TType::getQualifier((TType *)&arraySizes);
      *(ulong *)&pTVar14->field_0x1c = *(ulong *)&pTVar14->field_0x1c & 0xfffffffffffff000 | 0xfff;
      this_00 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                (**(code **)(*(long *)CONCAT44(extraout_var_06,iVar7) + 400))();
      name = std::__cxx11::
             basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                       (this_00);
      pTVar15 = makeInternalVariable(this,name,(TType *)&arraySizes);
      *ppTStack_40 = pTVar15;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
                (this,*ppTStack_40);
      TType::~TType((TType *)&arraySizes);
    }
    node = TIntermediate::addSymbol
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,*ppTStack_40
                     );
    iVar7 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    iVar7 = (**(code **)(*(long *)CONCAT44(extraout_var_07,iVar7) + 0x60))();
    iVar8 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    pTVar11 = (TArraySizes *)(**(code **)(*(long *)CONCAT44(extraout_var_08,iVar8) + 0x98))();
    if (local_215 == 0) {
      local_23c = 1;
    }
    else {
      local_23c = TArraySizes::getDimSize(pTVar11,0);
    }
    iVar8 = TArraySizes::getDimSize(pTVar11,(uint)(local_215 != 0));
    iVar9 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    uVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_09,iVar9) + 0xe8))();
    if ((uVar12 & 1) == 0) {
      __assert_fail("clipCullSym->getType().isArray()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                    ,0xaaf,
                    "TIntermAggregate *glslang::HlslParseContext::assignClipCullDistance(const TSourceLoc &, TOperator, int, TIntermTyped *, TIntermTyped *)"
                   );
    }
    iVar9 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    iVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_10,iVar9) + 0x60))();
    if (iVar9 != 1) {
      __assert_fail("clipCullSym->getType().getVectorSize() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                    ,0xab0,
                    "TIntermAggregate *glslang::HlslParseContext::assignClipCullDistance(const TSourceLoc &, TOperator, int, TIntermTyped *, TIntermTyped *)"
                   );
    }
    iVar9 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    iVar9 = (**(code **)(*(long *)CONCAT44(extraout_var_11,iVar9) + 0x38))();
    if (iVar9 != 1) {
      __assert_fail("clipCullSym->getType().getBasicType() == EbtFloat",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                    ,0xab1,
                    "TIntermAggregate *glslang::HlslParseContext::assignClipCullDistance(const TSourceLoc &, TOperator, int, TIntermTyped *, TIntermTyped *)"
                   );
    }
    clipCullAssign = (TIntermTyped *)0x0;
    iVar9 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
    bVar3 = (**(code **)(*(long *)CONCAT44(extraout_var_12,iVar9) + 0xe8))();
    iVar9 = (*(local_1d8->super_TIntermNode)._vptr_TIntermNode[0x1e])();
    bVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_13,iVar9) + 0xe8))();
    if (((((bVar3 & 1) == (bVar4 & 1)) && (iVar8 == local_210)) && (local_23c == local_214)) &&
       (iVar7 == iVar5)) {
      if (bVar2) {
        _clipCullOuterArrayPos =
             TIntermediate::addAssign
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,op,
                        &node->super_TIntermTyped,local_1d8,loc);
      }
      else {
        _clipCullOuterArrayPos =
             TIntermediate::addAssign
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,op,
                        local_1d8,&node->super_TIntermTyped,loc);
      }
      this_local = (HlslParseContext *)
                   TIntermediate::growAggregate
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                              (TIntermNode *)0x0,&_clipCullOuterArrayPos->super_TIntermNode);
      (*((TIntermNode *)
        &(this_local->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions)->
        _vptr_TIntermNode[0x31])(this_local,1);
    }
    else {
      pvVar10 = std::array<int,_2UL>::operator[]((array<int,_2UL> *)&vecItems,(long)semanticId);
      addIndex.loc._4_4_ = *pvVar10;
      addIndex.loc._0_4_ = 0;
      _internalInnerArrayPos = this;
      addIndex.this = (HlslParseContext *)loc;
      for (internalComponent = 0; internalComponent < local_214;
          internalComponent = internalComponent + 1) {
        for (local_1a0 = 0; local_1a0 < local_210; local_1a0 = local_1a0 + 1) {
          for (clipCullMember._4_4_ = 0; clipCullMember._4_4_ < iVar5;
              clipCullMember._4_4_ = clipCullMember._4_4_ + 1) {
            internalMember = &node->super_TIntermTyped;
            if (local_215 != 0) {
              internalMember =
                   assignClipCullDistance::anon_class_16_2_633b926d::operator()
                             ((anon_class_16_2_633b926d *)&internalInnerArrayPos,
                              &node->super_TIntermTyped,(int)addIndex.loc);
            }
            iVar7 = addIndex.loc._4_4_;
            addIndex.loc._4_4_ = addIndex.loc._4_4_ + 1;
            right_00 = assignClipCullDistance::anon_class_16_2_633b926d::operator()
                                 ((anon_class_16_2_633b926d *)&internalInnerArrayPos,internalMember,
                                  iVar7);
            if ((local_215 != 0) && (iVar8 <= addIndex.loc._4_4_)) {
              pvVar10 = std::array<int,_2UL>::operator[]
                                  ((array<int,_2UL> *)&vecItems,(long)semanticId);
              addIndex.loc._4_4_ = *pvVar10;
              addIndex.loc._0_4_ = (int)addIndex.loc + 1;
            }
            local_1b8 = local_1d8;
            if (1 < local_20c) {
              local_1b8 = assignClipCullDistance::anon_class_16_2_633b926d::operator()
                                    ((anon_class_16_2_633b926d *)&internalInnerArrayPos,local_1d8,
                                     internalComponent);
            }
            if (0 < local_20c) {
              local_1b8 = assignClipCullDistance::anon_class_16_2_633b926d::operator()
                                    ((anon_class_16_2_633b926d *)&internalInnerArrayPos,local_1b8,
                                     local_1a0);
            }
            iVar7 = (*(local_1d8->super_TIntermNode)._vptr_TIntermNode[0x1e])();
            uVar12 = (**(code **)(*(long *)CONCAT44(extraout_var_14,iVar7) + 0xd8))();
            if ((uVar12 & 1) != 0) {
              local_1b8 = assignClipCullDistance::anon_class_16_2_633b926d::operator()
                                    ((anon_class_16_2_633b926d *)&internalInnerArrayPos,local_1b8,
                                     clipCullMember._4_4_);
            }
            if (bVar2) {
              _clipCullOuterArrayPos =
                   TIntermediate::addAssign
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,op,
                              right_00,local_1b8,loc);
            }
            else {
              _clipCullOuterArrayPos =
                   TIntermediate::addAssign
                             ((this->super_TParseContextBase).super_TParseVersions.intermediate,op,
                              local_1b8,right_00,loc);
            }
            clipCullAssign =
                 (TIntermTyped *)
                 TIntermediate::growAggregate
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                            &clipCullAssign->super_TIntermNode,
                            &_clipCullOuterArrayPos->super_TIntermNode);
          }
        }
      }
      if (clipCullAssign == (TIntermTyped *)0x0) {
        __assert_fail("assignList != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                      ,0xb09,
                      "TIntermAggregate *glslang::HlslParseContext::assignClipCullDistance(const TSourceLoc &, TOperator, int, TIntermTyped *, TIntermTyped *)"
                     );
      }
      (*(clipCullAssign->super_TIntermNode)._vptr_TIntermNode[0x31])(clipCullAssign,1);
      this_local = (HlslParseContext *)clipCullAssign;
    }
  }
  else {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"unimplemented: clip/cull not currently implemented for this stage","");
    this_local = (HlslParseContext *)0x0;
  }
  return (TIntermAggregate *)this_local;
}

Assistant:

TIntermAggregate* HlslParseContext::assignClipCullDistance(const TSourceLoc& loc, TOperator op, int semanticId,
                                                           TIntermTyped* left, TIntermTyped* right)
{
    switch (language) {
    case EShLangFragment:
    case EShLangVertex:
    case EShLangGeometry:
        break;
    default:
        error(loc, "unimplemented: clip/cull not currently implemented for this stage", "", "");
        return nullptr;
    }

    TVariable** clipCullVar = nullptr;

    // Figure out if we are assigning to, or from, clip or cull distance.
    const bool isOutput = isClipOrCullDistance(left->getType());

    // This is the rvalue or lvalue holding the clip or cull distance.
    TIntermTyped* clipCullNode = isOutput ? left : right;
    // This is the value going into or out of the clip or cull distance.
    TIntermTyped* internalNode = isOutput ? right : left;

    const TBuiltInVariable builtInType = clipCullNode->getQualifier().builtIn;

    decltype(clipSemanticNSizeIn)* semanticNSize = nullptr;

    // Refer to either the clip or the cull distance, depending on semantic.
    switch (builtInType) {
    case EbvClipDistance:
        clipCullVar = isOutput ? &clipDistanceOutput : &clipDistanceInput;
        semanticNSize = isOutput ? &clipSemanticNSizeOut : &clipSemanticNSizeIn;
        break;
    case EbvCullDistance:
        clipCullVar = isOutput ? &cullDistanceOutput : &cullDistanceInput;
        semanticNSize = isOutput ? &cullSemanticNSizeOut : &cullSemanticNSizeIn;
        break;

    // called invalidly: we expected a clip or a cull distance.
    // static compile time problem: should not happen.
    default: assert(0); return nullptr;
    }

    // This is the offset in the destination array of a given semantic's data
    std::array<int, maxClipCullRegs> semanticOffset;

    // Calculate offset of variable of semantic N in destination array
    int arrayLoc = 0;
    int vecItems = 0;

    for (int x = 0; x < maxClipCullRegs; ++x) {
        // See if we overflowed the vec4 packing
        if ((vecItems + (*semanticNSize)[x]) > 4) {
            arrayLoc = (arrayLoc + 3) & (~0x3); // round up to next multiple of 4
            vecItems = 0;
        }

        semanticOffset[x] = arrayLoc;
        vecItems += (*semanticNSize)[x];
        arrayLoc += (*semanticNSize)[x];
    }


    // It can have up to 2 array dimensions (in the case of geometry shader inputs)
    const TArraySizes* const internalArraySizes = internalNode->getType().getArraySizes();
    const int internalArrayDims = internalNode->getType().isArray() ? internalArraySizes->getNumDims() : 0;
    // vector sizes:
    const int internalVectorSize = internalNode->getType().getVectorSize();
    // array sizes, or 1 if it's not an array:
    const int internalInnerArraySize = (internalArrayDims > 0 ? internalArraySizes->getDimSize(internalArrayDims-1) : 1);
    const int internalOuterArraySize = (internalArrayDims > 1 ? internalArraySizes->getDimSize(0) : 1);

    // The created type may be an array of arrays, e.g, for geometry shader inputs.
    const bool isImplicitlyArrayed = (language == EShLangGeometry && !isOutput);

    // If we haven't created the output already, create it now.
    if (*clipCullVar == nullptr) {
        // ClipDistance and CullDistance are handled specially in the entry point input/output copy
        // algorithm, because they may need to be unpacked from components of vectors (or a scalar)
        // into a float array, or vice versa.  Here, we make the array the right size and type,
        // which depends on the incoming data, which has several potential dimensions:
        //    * Semantic ID
        //    * vector size
        //    * array size
        // Of those, semantic ID and array size cannot appear simultaneously.
        //
        // Also to note: for implicitly arrayed forms (e.g, geometry shader inputs), we need to create two
        // array dimensions.  The shader's declaration may have one or two array dimensions.  One is always
        // the geometry's dimension.

        const bool useInnerSize = internalArrayDims > 1 || !isImplicitlyArrayed;

        const int requiredInnerArraySize = arrayLoc * (useInnerSize ? internalInnerArraySize : 1);
        const int requiredOuterArraySize = (internalArrayDims > 0) ? internalArraySizes->getDimSize(0) : 1;

        TType clipCullType(EbtFloat, clipCullNode->getType().getQualifier().storage, 1);
        clipCullType.getQualifier() = clipCullNode->getType().getQualifier();

        // Create required array dimension
        TArraySizes* arraySizes = new TArraySizes;
        if (isImplicitlyArrayed)
            arraySizes->addInnerSize(requiredOuterArraySize);
        arraySizes->addInnerSize(requiredInnerArraySize);
        clipCullType.transferArraySizes(arraySizes);

        // Obtain symbol name: we'll use that for the symbol we introduce.
        TIntermSymbol* sym = clipCullNode->getAsSymbolNode();
        assert(sym != nullptr);

        // We are moving the semantic ID from the layout location, so it is no longer needed or
        // desired there.
        clipCullType.getQualifier().layoutLocation = TQualifier::layoutLocationEnd;

        // Create variable and track its linkage
        *clipCullVar = makeInternalVariable(sym->getName().c_str(), clipCullType);

        trackLinkage(**clipCullVar);
    }

    // Create symbol for the clip or cull variable.
    TIntermSymbol* clipCullSym = intermediate.addSymbol(**clipCullVar);

    // vector sizes:
    const int clipCullVectorSize = clipCullSym->getType().getVectorSize();

    // array sizes, or 1 if it's not an array:
    const TArraySizes* const clipCullArraySizes = clipCullSym->getType().getArraySizes();
    const int clipCullOuterArraySize = isImplicitlyArrayed ? clipCullArraySizes->getDimSize(0) : 1;
    const int clipCullInnerArraySize = clipCullArraySizes->getDimSize(isImplicitlyArrayed ? 1 : 0);

    // clipCullSym has got to be an array of scalar floats, per SPIR-V semantics.
    // fixBuiltInIoType() should have handled that upstream.
    assert(clipCullSym->getType().isArray());
    assert(clipCullSym->getType().getVectorSize() == 1);
    assert(clipCullSym->getType().getBasicType() == EbtFloat);

    // We may be creating multiple sub-assignments.  This is an aggregate to hold them.
    // TODO: it would be possible to be clever sometimes and avoid the sequence node if not needed.
    TIntermAggregate* assignList = nullptr;

    // Holds individual component assignments as we make them.
    TIntermTyped* clipCullAssign = nullptr;

    // If the types are homomorphic, use a simple assign.  No need to mess about with
    // individual components.
    if (clipCullSym->getType().isArray() == internalNode->getType().isArray() &&
        clipCullInnerArraySize == internalInnerArraySize &&
        clipCullOuterArraySize == internalOuterArraySize &&
        clipCullVectorSize == internalVectorSize) {

        if (isOutput)
            clipCullAssign = intermediate.addAssign(op, clipCullSym, internalNode, loc);
        else
            clipCullAssign = intermediate.addAssign(op, internalNode, clipCullSym, loc);

        assignList = intermediate.growAggregate(assignList, clipCullAssign);
        assignList->setOperator(EOpSequence);

        return assignList;
    }

    // We are going to copy each component of the internal (per array element if indicated) to sequential
    // array elements of the clipCullSym.  This tracks the lhs element we're writing to as we go along.
    // We may be starting in the middle - e.g, for a non-zero semantic ID calculated above.
    int clipCullInnerArrayPos = semanticOffset[semanticId];
    int clipCullOuterArrayPos = 0;

    // Lambda to add an index to a node, set the type of the result, and return the new node.
    const auto addIndex = [this, &loc](TIntermTyped* node, int pos) -> TIntermTyped* {
        const TType derefType(node->getType(), 0);
        node = intermediate.addIndex(EOpIndexDirect, node, intermediate.addConstantUnion(pos, loc), loc);
        node->setType(derefType);
        return node;
    };

    // Loop through every component of every element of the internal, and copy to or from the matching external.
    for (int internalOuterArrayPos = 0; internalOuterArrayPos < internalOuterArraySize; ++internalOuterArrayPos) {
        for (int internalInnerArrayPos = 0; internalInnerArrayPos < internalInnerArraySize; ++internalInnerArrayPos) {
            for (int internalComponent = 0; internalComponent < internalVectorSize; ++internalComponent) {
                // clip/cull array member to read from / write to:
                TIntermTyped* clipCullMember = clipCullSym;

                // If implicitly arrayed, there is an outer array dimension involved
                if (isImplicitlyArrayed)
                    clipCullMember = addIndex(clipCullMember, clipCullOuterArrayPos);

                // Index into proper array position for clip cull member
                clipCullMember = addIndex(clipCullMember, clipCullInnerArrayPos++);

                // if needed, start over with next outer array slice.
                if (isImplicitlyArrayed && clipCullInnerArrayPos >= clipCullInnerArraySize) {
                    clipCullInnerArrayPos = semanticOffset[semanticId];
                    ++clipCullOuterArrayPos;
                }

                // internal member to read from / write to:
                TIntermTyped* internalMember = internalNode;

                // If internal node has outer array dimension, index appropriately.
                if (internalArrayDims > 1)
                    internalMember = addIndex(internalMember, internalOuterArrayPos);

                // If internal node has inner array dimension, index appropriately.
                if (internalArrayDims > 0)
                    internalMember = addIndex(internalMember, internalInnerArrayPos);

                // If internal node is a vector, extract the component of interest.
                if (internalNode->getType().isVector())
                    internalMember = addIndex(internalMember, internalComponent);

                // Create an assignment: output from internal to clip cull, or input from clip cull to internal.
                if (isOutput)
                    clipCullAssign = intermediate.addAssign(op, clipCullMember, internalMember, loc);
                else
                    clipCullAssign = intermediate.addAssign(op, internalMember, clipCullMember, loc);

                // Track assignment in the sequence.
                assignList = intermediate.growAggregate(assignList, clipCullAssign);
            }
        }
    }

    assert(assignList != nullptr);
    assignList->setOperator(EOpSequence);

    return assignList;
}